

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
::TPZParFrontStructMatrix
          (TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
           *this,TPZCompMesh *mesh)

{
  *(undefined8 *)&this->field_0x258 = 0x1807c48;
  *(undefined8 *)
   &this->
    super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
       = 0x1807d10;
  *(undefined4 *)&this->field_0x260 = 0;
  this->field_0x264 = 1;
  TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
  ::TPZStructMatrix(&this->
                     super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
                    ,&PTR_construction_vtable_104__01802040,mesh);
  *(undefined8 *)&this->field_0x258 = 0x1801fc8;
  *(undefined8 *)
   &this->
    super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
       = 0x1801de0;
  *(undefined8 *)
   &(this->
    super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
    ).field_0xa0 = 0x1801ec8;
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)
             &(this->
              super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
              ).field_0xd0);
  TPZStack<long,_10>::TPZStack(&this->felnum);
  TPZStack<TPZElementMatrix_*,_10>::TPZStack(&this->fekstack);
  TPZStack<TPZElementMatrix_*,_10>::TPZStack(&this->fefstack);
  this->fMaxStackSize = 500;
  *(undefined4 *)
   (&(this->
     super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
     ).field_0x8 +
   *(long *)(*(long *)&this->
                       super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
            + -0x60)) = 3;
  return;
}

Assistant:

TPZParFrontStructMatrix<TFront,TVar,TPar>::TPZParFrontStructMatrix(TPZCompMesh *mesh): TPZFrontStructMatrix<TFront,TVar,TPar>(mesh)
{
	fMaxStackSize = 500;
	TPZStructMatrix::SetNumThreads(3);
}